

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintCallGraph.cpp
# Opt level: O0

void __thiscall
wasm::PrintCallGraph::run(wasm::Module*)::CallPrinter::visitCall(wasm::Call__(void *this,Call *curr)

{
  Function *__args;
  ostream *poVar1;
  ostream *poVar2;
  pair<std::_Rb_tree_const_iterator<wasm::Name>,_bool> pVar3;
  Name name;
  Name name_00;
  Function *target;
  Call *curr_local;
  CallPrinter *this_local;
  
  __args = Module::getFunction(*(Module **)((long)this + 0xd8),
                               (Name)(curr->target).super_IString.str);
  pVar3 = std::set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>>::
          emplace<wasm::Name&>
                    ((set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>> *)
                     ((long)this + 0xe8),(Name *)__args);
  if (((pVar3.second ^ 0xffU) & 1) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"  \"");
    poVar2 = (ostream *)**(undefined8 **)((long)this + 0xe0);
    name.super_IString.str._M_str = (char *)poVar2;
    name.super_IString.str._M_len = (*(undefined8 **)((long)this + 0xe0))[1];
    poVar2 = wasm::operator<<((wasm *)poVar1,poVar2,name);
    poVar1 = std::operator<<(poVar2,"\" -> \"");
    poVar2 = (ostream *)(__args->super_Importable).super_Named.name.super_IString.str._M_len;
    name_00.super_IString.str._M_str = (char *)poVar2;
    name_00.super_IString.str._M_len =
         (size_t)(__args->super_Importable).super_Named.name.super_IString.str._M_str;
    poVar2 = wasm::operator<<((wasm *)poVar1,poVar2,name_00);
    std::operator<<(poVar2,"\"; // call\n");
  }
  return;
}

Assistant:

void visitCall(Call* curr) {
        auto* target = module->getFunction(curr->target);
        if (!visitedTargets.emplace(target->name).second) {
          return;
        }
        std::cout << "  \"" << currFunction->name << "\" -> \"" << target->name
                  << "\"; // call\n";
      }